

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CascRootFile_WoW6.cpp
# Opt level: O0

int RootHandler_CreateWoW6(TCascStorage *hs,LPBYTE pbRootFile,DWORD cbRootFile,DWORD dwLocaleMask)

{
  LPBYTE pBVar1;
  PFILE_ROOT_ENTRY this;
  int local_4c;
  undefined1 local_48 [4];
  int nError;
  FILE_LOCALE_BLOCK LocaleBlock;
  TRootHandler_WoW6 *pRootHandler;
  DWORD dwLocaleMask_local;
  DWORD cbRootFile_local;
  LPBYTE pbRootFile_local;
  TCascStorage *hs_local;
  
  LocaleBlock.pFileEntries = (PFILE_ROOT_ENTRY)0x0;
  local_4c = 1000;
  pBVar1 = TRootHandler_WoW6::CaptureLocaleBlock
                     ((FILE_LOCALE_BLOCK *)local_48,pbRootFile,pbRootFile + cbRootFile);
  if (pBVar1 != (LPBYTE)0x0) {
    this = (PFILE_ROOT_ENTRY)operator_new(0x78);
    TRootHandler_WoW6::TRootHandler_WoW6((TRootHandler_WoW6 *)this);
    LocaleBlock.pFileEntries = this;
    if ((this != (PFILE_ROOT_ENTRY)0x0) &&
       (local_4c = TRootHandler_WoW6::Load
                             ((TRootHandler_WoW6 *)this,pbRootFile,pbRootFile + cbRootFile,
                              dwLocaleMask), local_4c != 0)) {
      if (LocaleBlock.pFileEntries != (PFILE_ROOT_ENTRY)0x0) {
        (**(code **)(*(long *)((LocaleBlock.pFileEntries)->CKey).Value + 8))();
      }
      LocaleBlock.pFileEntries = (PFILE_ROOT_ENTRY)0x0;
    }
  }
  hs->pRootHandler = (TRootHandler *)LocaleBlock.pFileEntries;
  return local_4c;
}

Assistant:

int RootHandler_CreateWoW6(TCascStorage * hs, LPBYTE pbRootFile, DWORD cbRootFile, DWORD dwLocaleMask)
{
    TRootHandler_WoW6 * pRootHandler = NULL;
    FILE_LOCALE_BLOCK LocaleBlock;
    int nError = ERROR_BAD_FORMAT;

    // Verify whether this is really a WoW block
    if(TRootHandler_WoW6::CaptureLocaleBlock(LocaleBlock, pbRootFile, pbRootFile + cbRootFile))
    {
        pRootHandler = new TRootHandler_WoW6();
        if(pRootHandler != NULL)
        {
            // Load the root directory. If load failed, we free the object
            nError = pRootHandler->Load(pbRootFile, pbRootFile + cbRootFile, dwLocaleMask);
            if(nError != ERROR_SUCCESS)
            {
                delete pRootHandler;
                pRootHandler = NULL;
            }
        }
    }

    // Assign the root directory (or NULL) and return error
    hs->pRootHandler = pRootHandler;
    return nError;
}